

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O3

LispPTR Unix_handlecomm(LispPTR *args)

{
  ushort uVar1;
  UJTYPE UVar2;
  int iVar3;
  __pid_t __pgrp;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  uint *puVar8;
  ulong uVar9;
  int *piVar10;
  size_t sVar11;
  char *pcVar12;
  DLword *pDVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  unsigned_short len;
  uchar ch;
  byte local_b0;
  byte local_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  undefined2 local_aa;
  undefined1 local_a8 [18];
  undefined8 local_96;
  undefined8 uStack_8e;
  undefined8 local_86;
  undefined8 uStack_7e;
  undefined8 local_76;
  undefined8 uStack_6e;
  undefined8 local_66;
  undefined8 uStack_5e;
  undefined8 local_56;
  undefined4 uStack_4e;
  undefined4 uStack_4a;
  undefined4 uStack_46;
  undefined8 uStack_42;
  long lVar7;
  
  uVar18 = *args;
  if ((uVar18 & 0xfff0000) == 0xf0000) {
    uVar18 = uVar18 | 0xffff0000;
  }
  else if ((uVar18 & 0xfff0000) == 0xe0000) {
    uVar18 = uVar18 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar18 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar18 = *(uint *)(Lisp_world + uVar18);
  }
  switch(uVar18) {
  case 0:
    uVar18 = socket(1,1,0);
    if (-1 < (int)uVar18) {
      sprintf(build_socket_pathname::PathName,"/tmp/LPU%ld-%d",StartTime,(ulong)uVar18);
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = '\0';
      local_a8[9] = '\0';
      local_a8._10_8_ = 0;
      local_96 = 0;
      uStack_8e = 0;
      local_86 = 0;
      uStack_7e = 0;
      local_76 = 0;
      uStack_6e = 0;
      local_66 = 0;
      uStack_5e = 0;
      local_56 = 0;
      uStack_4e = 0;
      uStack_4a = 0;
      uStack_46 = 0;
      uStack_42 = 0;
      local_a8._0_2_ = 1;
      strcpy(local_a8 + 2,build_socket_pathname::PathName);
      iVar5 = bind(uVar18,(sockaddr *)local_a8,0x6e);
      if (iVar5 < 0) {
        Unix_handlecomm_cold_3();
        return 0;
      }
      iVar5 = listen(uVar18,1);
      if (iVar5 < 0) {
        perror("Listen");
      }
      local_af = 0;
      bStack_ae = 0;
      bStack_ac = 0;
      bStack_ab = 0;
      local_b0 = 0x46;
      bStack_ad = (byte)uVar18;
      write(UnixPipeOut,&local_b0,6);
      WriteLispStringToPipe(args[1]);
      iVar5 = UnixPipeIn;
      sVar6 = read(UnixPipeIn,&local_b0,6);
      if (sVar6 < 0) {
        piVar10 = __errno_location();
        do {
          if ((*piVar10 != 0xb) && (*piVar10 != 4)) {
            perror("reading UnixPipeIn");
            break;
          }
          sVar6 = read(iVar5,&local_b0,6);
        } while (sVar6 < 0);
      }
      if (bStack_ad != 1) {
        close(uVar18);
        unlink(build_socket_pathname::PathName);
        return 0;
      }
      do {
        alarm(TIMEOUT_TIME);
        piVar10 = __errno_location();
        do {
          *piVar10 = 0;
          uVar14 = accept(uVar18,(sockaddr *)0x0,(socklen_t *)0x0);
          if (uVar14 != 0xffffffff) {
            alarm(0);
            if ((int)uVar14 < 0) goto LAB_00137df1;
            uVar16 = fcntl(uVar14,3,0);
            iVar5 = fcntl(uVar14,4,(ulong)(uVar16 | 0x800));
            if (iVar5 == -1) {
              pcVar12 = "setting up fifo to nodelay";
              goto LAB_00138cd1;
            }
            UJ[uVar14].type = UJPROCESS;
            UJ[uVar14].status = -1;
            UJ[uVar14].PID =
                 CONCAT13(bStack_ab,
                          CONCAT12(bStack_ac,CONCAT11(bStack_ae,local_af) << 8 | (ushort)bStack_ae))
            ;
            close(uVar18);
            unlink(build_socket_pathname::PathName);
            if (uVar14 < 0x10000) {
              return uVar14 | 0xe0000;
            }
            goto LAB_00138dde;
          }
        } while (*piVar10 == 4);
        alarm(0);
LAB_00137df1:
      } while (*piVar10 == 4);
      perror("Accept.");
      close(uVar18);
      iVar5 = unlink(build_socket_pathname::PathName);
      if (-1 < iVar5) {
        return 0;
      }
      pcVar12 = "Unlink";
      goto LAB_00138cd1;
    }
    goto LAB_00138cca;
  case 1:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    uVar14 = args[2];
    uVar9 = (ulong)uVar14;
    if ((uVar14 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar14 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
      }
      uVar9 = (ulong)*(uint *)(Lisp_world + uVar9);
    }
    local_a8[0] = (char)uVar9;
    if ((int)uVar18 < 0) {
      return 0;
    }
    if (NPROCS <= (int)uVar18) {
      return 0;
    }
    if (UJ[uVar18].type == UJUNUSED) {
      return 0;
    }
    if (UJ[uVar18].status != -1) {
      return 0;
    }
    uVar14 = UJ[uVar18].type + 4;
    if (3 < uVar14) {
      return 0;
    }
    if (uVar14 == 1) {
      return 0;
    }
    sVar6 = write(uVar18,local_a8,1);
    if ((int)sVar6 == 0) {
      wait_for_comm_processes();
      return 0;
    }
    return 0xe0001;
  case 2:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      return 0;
    }
    if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    if ((int)uVar18 < 0) {
      return 0;
    }
    if (NPROCS <= (int)uVar18) {
      return 0;
    }
    uVar14 = UJ[uVar18].type + 4;
    if (uVar14 < 5) {
      if ((0xdU >> (uVar14 & 0x1f) & 1) == 0) {
        return 0;
      }
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      while( true ) {
        *piVar10 = 0;
        sVar6 = read(uVar18,local_a8,1);
        iVar5 = (int)sVar6;
        if (iVar5 != -1) break;
        if (*piVar10 != 4) {
          alarm(0);
          wait_for_comm_processes();
LAB_00138572:
          if (UJ[uVar18].status != -1) {
            return 0;
          }
          if (*piVar10 != 0xb) {
            return 0;
          }
          return 0x4c;
        }
      }
      alarm(0);
      if (iVar5 < 1) {
        wait_for_comm_processes();
        if ((iVar5 == 0) && (UJ[uVar18].status == -1)) {
          return 0x4c;
        }
        goto LAB_00138572;
      }
      uVar14 = (uint)local_a8[0];
      goto LAB_00138da3;
    }
  case 3:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      return 0x4c;
    }
    if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    if ((int)uVar18 < 0) {
      return 0x4c;
    }
    if (NPROCS <= (int)uVar18) {
      return 0x4c;
    }
    if (UJ[uVar18].type == UJUNUSED) {
      return 0x4c;
    }
    close(uVar18);
    if ((uint)(UJ[uVar18].type + ~UJSOCKET) < 2) {
      iVar5 = 10;
      do {
        wait_for_comm_processes();
        if (UJ[uVar18].status != -1) break;
        usleep(10000);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      if (UJ[uVar18].status == -1) {
        iVar5 = 9;
        kill(UJ[uVar18].PID,9);
        do {
          wait_for_comm_processes();
          usleep(10000);
          bVar19 = iVar5 != 0;
          iVar5 = iVar5 + -1;
          if (UJ[uVar18].status != -1) break;
        } while (bVar19);
      }
    }
    else if ((UJ[uVar18].type == UJSOCKET) && (UJ[uVar18].pathname != (char *)0x0)) {
      iVar5 = unlink(UJ[uVar18].pathname);
      if (iVar5 < 0) {
        perror("Kill 3 unlink");
      }
      free(UJ[uVar18].pathname);
      UJ[uVar18].pathname = (char *)0x0;
    }
    UJ[uVar18].type = UJUNUSED;
    UJ[uVar18].PID = 0;
    UJ[uVar18].pathname = (char *)0x0;
    uVar14 = UJ[uVar18].status;
    break;
  case 4:
  case 0xb:
    uVar14 = posix_openpt(2);
    if ((int)uVar14 < 0) {
      Unix_handlecomm_cold_2();
      return 0;
    }
    grantpt(uVar14);
    unlockpt(uVar14);
    pcVar12 = ptsname(uVar14);
    strcpy(local_a8,pcVar12);
    uVar16 = fcntl(uVar14,3,0);
    fcntl(uVar14,4,(ulong)(uVar16 | 0x800));
    local_b0 = (uVar18 == 4) * '\x03' + 0x50;
    local_af = (byte)local_a8._0_2_;
    bStack_ae = SUB21(local_a8._0_2_,1);
    bStack_ad = (byte)uVar14;
    bStack_ac = 0;
    bStack_ab = 0;
    write(UnixPipeOut,&local_b0,6);
    sVar11 = strlen(local_a8);
    uVar16 = (int)sVar11 + 1;
    local_aa = (undefined2)uVar16;
    write(UnixPipeOut,&local_aa,2);
    write(UnixPipeOut,local_a8,(ulong)(uVar16 & 0xffff));
    if (uVar18 != 4) {
      WriteLispStringToPipe(args[1]);
      WriteLispStringToPipe(args[2]);
    }
    iVar5 = UnixPipeIn;
    sVar6 = read(UnixPipeIn,&local_b0,6);
    if (sVar6 < 0) {
      piVar10 = __errno_location();
      do {
        if ((*piVar10 != 0xb) && (*piVar10 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar6 = read(iVar5,&local_b0,6);
      } while (sVar6 < 0);
    }
    uVar18 = (uint)bStack_ad;
    if (uVar18 != 1) {
      puts("Fork failed.");
      fflush(_stdout);
      printf("d = %d, %d, %d, %d, %d, %d\n",(ulong)local_b0,(ulong)local_af,(ulong)bStack_ae,
             (ulong)uVar18,(ulong)bStack_ac,(uint)bStack_ab);
      close(uVar14);
      return 0;
    }
    uVar18 = fcntl(uVar14,3,0);
    fcntl(uVar14,4,(ulong)(uVar18 | 0x800));
    UJ[uVar14].type = UJSHELL;
    UJ[uVar14].PID =
         CONCAT13(bStack_ab,
                  CONCAT12(bStack_ac,CONCAT11(bStack_ae,local_af) << 8 | (ushort)bStack_ae));
    printf("Shell job %d, PID = %d\n",(ulong)uVar14,(ulong)(uint)UJ[uVar14].PID);
    UJ[uVar14].status = -1;
    goto LAB_00138d9b;
  case 5:
    close_unix_descriptors();
    return 0x4c;
  case 6:
    bStack_ae = 0;
    bStack_ad = 0;
    bStack_ac = 0;
    bStack_ab = 0;
    local_b0 = 0x43;
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    local_af = (byte)uVar18;
    bStack_ad = 1;
    write(UnixPipeOut,&local_b0,6);
    iVar5 = UnixPipeIn;
    sVar6 = read(UnixPipeIn,&local_b0,6);
    if (sVar6 < 0) {
      piVar10 = __errno_location();
      do {
        if ((*piVar10 != 0xb) && (*piVar10 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar6 = read(iVar5,&local_b0,6);
      } while (sVar6 < 0);
    }
    switch(UJ[(int)uVar18].type) {
    case UJSOSTREAM:
    case UJPROCESS:
    case UJSHELL:
      close(uVar18);
      break;
    case UJSOCKET:
      close(uVar18);
      if (UJ[(int)uVar18].pathname != (char *)0x0) {
        unlink(UJ[(int)uVar18].pathname);
        free(UJ[(int)uVar18].pathname);
        UJ[(int)uVar18].pathname = (char *)0x0;
      }
    }
    UJ[(int)uVar18].type = UJUNUSED;
    UJ[(int)uVar18].PID = 0;
    return 0x4c;
  case 7:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    wait_for_comm_processes();
    uVar14 = UJ[(int)uVar18].status;
    if (uVar14 == 0xffffffff) {
      return 0x4c;
    }
    break;
  case 8:
    return 0xe000f;
  case 9:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      return 0;
    }
    if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    if ((int)uVar18 < 0) {
      return 0;
    }
    if (NPROCS <= (int)uVar18) {
      return 0;
    }
    uVar14 = UJ[uVar18].type + 4;
    if (4 < uVar14) goto switchD_001378e9_caseD_a;
    if ((0xdU >> (uVar14 & 0x1f) & 1) == 0) {
      return 0;
    }
    pDVar13 = Lisp_world + args[2];
    uVar9 = read(uVar18,pDVar13,0x200);
    word_swap_page(pDVar13,0x80);
    if ((int)uVar9 < 1) {
      wait_for_comm_processes();
      if ((int)uVar9 != 0) {
        puVar8 = (uint *)__errno_location();
        if (0xb < *puVar8) {
          return 0;
        }
        if ((0x811U >> (*puVar8 & 0x1f) & 1) == 0) {
          return 0;
        }
      }
      iVar5 = UJ[uVar18].status;
      goto joined_r0x00138bbc;
    }
    goto LAB_00138ad8;
  case 10:
switchD_001378e9_caseD_a:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    uVar14 = args[2];
    uVar9 = (ulong)uVar14;
    if ((uVar14 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar14 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      uVar9 = (ulong)*(uint *)(Lisp_world + uVar9);
    }
    uVar14 = args[3];
    uVar17 = (ulong)uVar14;
    if ((uVar14 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar14 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar17);
      }
      uVar17 = (ulong)*(uint *)(Lisp_world + uVar17);
    }
    if ((int)uVar18 < 0) {
      return 0;
    }
    if (NPROCS <= (int)uVar18) {
      return 0;
    }
    if (UJ[uVar18].type != UJSHELL) {
      return 0;
    }
    if (UJ[uVar18].status != -1) {
      return 0;
    }
    local_a8._0_2_ = (undefined2)uVar9;
    local_a8._4_4_ = 0;
    local_a8._2_2_ = (ushort)uVar17;
    iVar5 = ioctl(uVar18,0x5414);
    if (((-1 < iVar5) && (__pgrp = tcgetpgrp(uVar18), -1 < __pgrp)) &&
       (iVar5 = killpg(__pgrp,0x1c), -1 < iVar5)) {
      return 0x4c;
    }
    puVar8 = (uint *)__errno_location();
    uVar14 = *puVar8;
    break;
  case 0xc:
    uVar18 = socket(1,1,0);
    if (-1 < (int)uVar18) {
      uVar14 = args[1];
      if ((uVar14 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
      }
      pDVar13 = Lisp_world;
      iVar5 = *(int *)(Lisp_world + (ulong)uVar14 + 4);
      iVar3 = 0x800;
      if (iVar5 < 0x800) {
        iVar3 = iVar5;
      }
      lVar7 = (long)iVar3;
      if ((char)Lisp_world[(ulong)uVar14 + 3] == 'D') {
        if (iVar5 == 0) {
          pcVar12 = shcom;
        }
        else {
          lVar7 = lVar7 + (ulong)(lVar7 == 0);
          pDVar13 = Lisp_world +
                    (ulong)Lisp_world[(ulong)uVar14 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar14) & 0xfffffff);
          pcVar12 = shcom;
          do {
            *pcVar12 = *(char *)((ulong)pDVar13 ^ 2);
            pcVar12 = pcVar12 + 1;
            pDVar13 = pDVar13 + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        *pcVar12 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar14 + 3] == 'C') {
        if (iVar5 != 0) {
          uVar16 = *(uint *)(Lisp_world + uVar14);
          uVar1 = Lisp_world[(ulong)uVar14 + 2];
          lVar15 = 0;
          do {
            shcom[lVar15] =
                 *(char *)((long)pDVar13 + lVar15 + (ulong)uVar1 + (ulong)(uVar16 & 0xfffffff) * 2 ^
                          3);
            lVar15 = lVar15 + 1;
          } while (lVar7 + (ulong)(lVar7 == 0) != lVar15);
        }
        shcom[lVar7] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      sVar11 = strlen(shcom);
      pcVar12 = (char *)malloc(sVar11 + 1);
      UJ[uVar18].pathname = pcVar12;
      strcpy(UJ[uVar18].pathname,shcom);
      local_a8._0_2_ = 1;
      strcpy(local_a8 + 2,shcom);
      iVar5 = bind(uVar18,(sockaddr *)local_a8,0x6e);
      if (iVar5 < 0) {
        Unix_handlecomm_cold_1();
        return 0;
      }
      iVar5 = listen(uVar18,1);
      if (iVar5 < 0) {
        perror("Listen");
      }
      uVar14 = fcntl(uVar18,3,0);
      fcntl(uVar18,4,(ulong)(uVar14 | 0x800));
      UJ[uVar18].status = -1;
      UJ[uVar18].PID = -1;
      UJ[uVar18].type = UJSOCKET;
      if (uVar18 < 0x10000) {
        return uVar18 | 0xe0000;
      }
      goto LAB_00138dde;
    }
LAB_00138cca:
    pcVar12 = "socket open";
LAB_00138cd1:
    perror(pcVar12);
    return 0;
  case 0xd:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    if (UJ[(int)uVar18].type != UJSOCKET) {
      return 0;
    }
    if (UJ[(int)uVar18].pathname == (char *)0x0) {
      return 0;
    }
    do {
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        uVar14 = accept(uVar18,(sockaddr *)0x0,(socklen_t *)0x0);
        if (uVar14 != 0xffffffff) {
          alarm(0);
          if ((int)uVar14 < 0) goto LAB_00138887;
          UJ[uVar14].status = -1;
          UJ[uVar14].PID = -1;
          UJ[uVar14].type = UJSOSTREAM;
          goto LAB_00138d9b;
        }
      } while (*piVar10 == 4);
      alarm(0);
LAB_00138887:
      if (*piVar10 != 4) {
        if (*piVar10 != 0xb) {
          perror("Lisp socket accept");
          return 0;
        }
        return 0xfffff;
      }
    } while( true );
  case 0xe:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      return 0;
    }
    if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    if ((int)uVar18 < 0) {
      return 0;
    }
    if (NPROCS <= (int)uVar18) {
      return 0;
    }
    UVar2 = UJ[uVar18].type;
    if (UVar2 == UJUNUSED) {
      return 0;
    }
    if (UVar2 < UJUNUSED) {
      if (0xfffeffff < (uint)UVar2) {
        return UVar2 & 0xfffff;
      }
    }
    else if ((uint)UVar2 < 0x10000) {
      return UVar2 | 0xe0000;
    }
    goto LAB_00138dde;
  case 0xf:
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      uVar18 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar18 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
      }
      uVar18 = *(uint *)(Lisp_world + uVar18);
    }
    pDVar13 = Lisp_world;
    uVar14 = args[2];
    uVar16 = args[3];
    if ((uVar16 & 0xfff0000) == 0xf0000) {
      uVar16 = uVar16 | 0xffff0000;
    }
    else if ((uVar16 & 0xfff0000) == 0xe0000) {
      uVar16 = uVar16 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar16 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar16 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar16);
      }
      uVar16 = *(uint *)(Lisp_world + uVar16);
    }
    uVar4 = UJ[(int)uVar18].type + 4;
    if (4 < uVar4) {
      return 0;
    }
    if ((0xdU >> (uVar4 & 0x1f) & 1) == 0) {
      return 0;
    }
    pDVar13 = pDVar13 + uVar14;
    uVar14 = (int)(uVar16 + 3) >> 2;
    word_swap_page(pDVar13,uVar14);
    uVar9 = write(uVar18,pDVar13,(long)(int)uVar16);
    word_swap_page(pDVar13,uVar14);
    if ((int)uVar9 < 1) {
      wait_for_comm_processes();
      if (((int)uVar9 != 0) && (piVar10 = __errno_location(), *piVar10 != 0xb)) {
        return 0;
      }
      iVar5 = UJ[(int)uVar18].status;
joined_r0x00138bbc:
      if (iVar5 == -1) {
        return 0x4c;
      }
      return 0;
    }
LAB_00138ad8:
    if ((uVar9 & 0x7fff0000) == 0) {
      return (uint)uVar9 | 0xe0000;
    }
    goto LAB_00138dde;
  default:
    return 0;
  }
  if ((int)uVar14 < 0) {
    if (0xfffeffff < uVar14) {
      return uVar14 & 0xfffff;
    }
  }
  else {
LAB_00138d9b:
    if (uVar14 < 0x10000) {
LAB_00138da3:
      return uVar14 | 0xe0000;
    }
  }
LAB_00138dde:
  error("Not Smallp data");
  return 0xe0000;
}

Assistant:

LispPTR Unix_handlecomm(LispPTR *args) {
  int command, dest, slot;
  unsigned char d[6];
  unsigned char ch;
  unsigned char buf[1];

  /* Get command */
  N_GETNUMBER(args[0], command, bad);
  DBPRINT(("\nUnix_handlecomm: command %d\n", command));

  switch (command) {
    case 0: /* Fork pipe process */
    {
      char *PipeName;
      int PipeFD, sockFD;

      /* First create the socket */
      struct sockaddr_un sock;
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }

      /* then bind it to a canonical pathname */
      PipeName = build_socket_pathname(sockFD);
      memset(&sock, 0, sizeof(sock));
      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, PipeName);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        perror("binding sockets");
        unlink(PipeName);
        return (NIL);
      }

      DBPRINT(("Socket %d bound to name %s.\n", sockFD, PipeName));

      if (listen(sockFD, 1) < 0) perror("Listen");

      memset(d, 0, sizeof(d));
      d[0] = 'F';
      d[3] = sockFD;
      write(UnixPipeOut, d, 6);
      WriteLispStringToPipe(args[1]);

      DBPRINT(("Sending cmd string: %s\n", shcom));

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If it worked, return job # */
      if (d[3] == 1) {
      case0_lp:
        TIMEOUT(PipeFD = accept(sockFD, NULL, NULL));
        if (PipeFD < 0) {
          if (errno == EINTR) goto case0_lp;
          perror("Accept.");
          close(sockFD);
          if (unlink(PipeName) < 0) perror("Unlink");
          return (NIL);
        }
        if (fcntl(PipeFD, F_SETFL, fcntl(PipeFD, F_GETFL, 0) | O_NONBLOCK) == -1) {
          perror("setting up fifo to nodelay");
          return (NIL);
        }
        UJ[PipeFD].type = UJPROCESS;
        UJ[PipeFD].status = -1;
        UJ[PipeFD].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        close(sockFD);
        unlink(PipeName);
        DBPRINT(("New process: slot/PipeFD %d PID %d\n", PipeFD, UJ[PipeFD].PID));
        return (GetSmallp(PipeFD));
      } else {
        DBPRINT(("Fork request failed."));
        close(sockFD);
        unlink(PipeName);
        return (NIL);
      }
    }

    case 1: /* Write byte */
      /* Get job #, Byte */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], dest, bad);
      ch = dest; /* ch is a char */

      if (valid_slot(slot) && (UJ[slot].status == -1)) switch (UJ[slot].type) {
          case UJPROCESS:
          case UJSHELL:
          case UJSOSTREAM:
            dest = write(slot, &ch, 1);
            if (dest == 0) {
              wait_for_comm_processes();
              return (NIL);
            } else
              return (GetSmallp(1));

	  case UJSOCKET:
	  case UJUNUSED:
	    return (NIL);
        }
      break;

    case 2: /* Read byte */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence status != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      N_GETNUMBER(args[1], slot, bad); /* Get job # */

      if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */
      switch (UJ[slot].type) {
        case UJPROCESS:
        case UJSHELL:
        case UJSOSTREAM:
          TIMEOUT(dest = read(slot, buf, 1));
          if (dest > 0) return (GetSmallp(buf[0]));
          /* Something's amiss; check our process status */
          wait_for_comm_processes();
          if ((dest == 0) &&
              (UJ[slot].status == -1)) { /* No available chars, but other guy still running */
            DBPRINT(("dest = 0, status still -1\n"));
            return (ATOM_T);
          }
          if ((UJ[slot].status == -1) &&
              ((errno == EWOULDBLOCK) ||
               (errno == EAGAIN))) { /* No available chars, but other guy still running */
            DBPRINT((" dest<0, EWOULDBLOCK\n"));
            return (ATOM_T);
          }
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
          return (NIL);

	case UJSOCKET:
	case UJUNUSED:
	    return (NIL);
      }

    case 3: /* Kill process */
            /* Maiko uses this as CLOSEF, so "process" is a misnomer */

      N_GETNUMBER(args[1], slot, bad);

      DBPRINT(("Terminating process in slot %d.\n", slot));
      if (!valid_slot(slot)) return (ATOM_T);
      /* in all cases we need to close() the file descriptor */
      if (slot == 0) DBPRINT(("ZERO SLOT\n"));
      close(slot);
      switch (UJ[slot].type) {
      case UJSHELL:
      case UJPROCESS:
        /* wait for up to 0.1s for it to exit on its own after the close() */
        for (int i = 0; i < 10; i++) {
          wait_for_comm_processes();
          if (UJ[slot].status != -1) break;
          usleep(10000);
        }
        /* check again before we terminate it */
        if (UJ[slot].status != -1) break;
        kill(UJ[slot].PID, SIGKILL);
        for (int i = 0; i < 10; i++) {
          /* Waiting for the process to exit is possibly risky.
             Sending SIGKILL is always supposed to kill
             a process, but on very rare occurrences this doesn't
             happen because of a Unix kernel bug, usually a user-
             written device driver which hasn't been fully
             debugged.  So we time it out just be safe. */
          wait_for_comm_processes();
          usleep(10000);
          if (UJ[slot].status != -1) break;
        }
        break;
      case UJSOCKET:
        if (UJ[slot].pathname) {
          DBPRINT(("Unlinking %s\n", UJ[slot].pathname));
          if (unlink(UJ[slot].pathname) < 0) perror("Kill 3 unlink");
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;
      case UJSOSTREAM:
      case UJUNUSED:
	break;
      }
      UJ[slot].type = UJUNUSED;
      UJ[slot].PID = 0;
      UJ[slot].pathname = NULL;

      /* If status available, return it, otherwise T */
      return (GetSmallp(UJ[slot].status));

    case 4:
    case 11: /* Fork PTY process */
    {
      char SlavePTY[32];
      int Master;
      unsigned short len;

      Master = FindAvailablePty(SlavePTY);
      DBPRINT(("Fork Shell; Master PTY = %d. Slave=%c%c.\n", Master, SlavePTY[0], SlavePTY[1]));
      if (Master < 0) {
        printf("Open of lisp side of PTY failed.\n");
        fflush(stdout);
        return (NIL);
      }

      d[0] = (command == 4) ? 'S' : 'P';
      d[1] = SlavePTY[0];
      d[2] = SlavePTY[1];
      d[3] = Master;
      d[4] = '\0';
      d[5] = '\0';
      write(UnixPipeOut, d, 6);

      len = strlen(SlavePTY) + 1;
      write(UnixPipeOut, &len, 2);
      write(UnixPipeOut, SlavePTY, len);

      if (command != 4) { /* New style has arg1 = termtype, arg2 = command */
        WriteLispStringToPipe(args[1]);
        WriteLispStringToPipe(args[2]);
      }

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If successful, return job # */
      DBPRINT(("Pipe/fork result = %d.\n", d[3]));
      if (d[3] == 1) {
        /* Set up the IO not to block */
        fcntl(Master, F_SETFL, fcntl(Master, F_GETFL, 0) | O_NONBLOCK);

        UJ[Master].type = UJSHELL; /* so we can find them */
        UJ[Master].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        printf("Shell job %d, PID = %d\n", Master, UJ[Master].PID);
        UJ[Master].status = -1;
        DBPRINT(("Forked pty in slot %d.\n", Master));
        return (GetSmallp(Master));
      } else {
        printf("Fork failed.\n");
        fflush(stdout);
        printf("d = %d, %d, %d, %d, %d, %d\n", d[0], d[1], d[2], d[3], d[4], d[5]);
        close(Master);
        return (NIL);
      }
    }

    case 5: /* Kill all the subprocesses */ close_unix_descriptors(); return (ATOM_T);

    case 6: /* Kill this subprocess */
      memset(d, 0, sizeof(d));
      d[0] = 'C';

      /* Get job # */
      N_GETNUMBER(args[1], dest, bad);
      d[1] = dest;

      d[3] = 1;
      write(UnixPipeOut, d, 6);

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      switch (UJ[dest].type) {
        case UJUNUSED:
          break;

        case UJSHELL:
          DBPRINT(("Kill 5 closing shell desc %d.\n", dest));
          close(dest);
          break;

        case UJPROCESS:
          DBPRINT(("Kill 5 closing process desc %d.\n", dest));
          close(dest);
          break;

        case UJSOCKET:
          /* close a socket; be sure and unlink the file handle */
          DBPRINT(("Kill 5 closing raw socket desc %d.\n", dest));
          close(dest);
          if (UJ[dest].pathname != NULL) {
            unlink(UJ[dest].pathname);
            free(UJ[dest].pathname);
            UJ[dest].pathname = NULL;
          } /* else return an error somehow... */
          break;

        case UJSOSTREAM:
          DBPRINT(("Kill 5 closing socket stream %d.\n", dest));
          close(dest);
          break;
      }

      UJ[dest].type = UJUNUSED;
      UJ[dest].PID = 0;
      return (ATOM_T);
    /* break; */

    case 7: /* Current job status */

      N_GETNUMBER(args[1], slot, bad); /* Get job # */
      wait_for_comm_processes();       /* Make sure we're up to date */

      if (UJ[slot].status == -1)
        return (ATOM_T);
      else
        return (GetSmallp(UJ[slot].status));

    case 8: /* Return largest supported command */ return (GetSmallp(15));

    case 9: /* Read buffer */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence ForkedStatus != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      {
        DLword *bufp;
        int terno; /* holds errno thru sys calls after I/O fails */

        N_GETNUMBER(args[1], slot, bad);     /* Get job # */
        if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */

        bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
        DBPRINT(("Read buffer slot %d, type is %d buffer LAddr 0x%x (native %p)\n", slot, UJ[slot].type, args[2], bufp));

        switch (UJ[slot].type) {
          case UJSHELL:
          case UJPROCESS:
          case UJSOSTREAM: dest = read(slot, bufp, 512);
#ifdef BYTESWAP
            word_swap_page(bufp, 128);
#endif /* BYTESWAP */

            if (dest > 0) { /* Got characters.  If debugging, print len &c */
              /* printf("got %d chars\n", dest); */
              return (GetSmallp(dest));
            }

            /* Something's amiss; update process status */
            DBPRINT(("Problem: Got status %d from read, errno %d.\n", dest, errno));
            wait_for_comm_processes(); /* make sure we're up to date */
            if (((dest == 0) || (errno == EINTR) || (errno == 0) || (errno == EAGAIN) ||
                 (errno == EWOULDBLOCK)) &&
                (UJ[slot].status == -1))
              /* No available chars, but other guy still running */
              return (ATOM_T);

            /* At this point, we either got an I/O error, or there */
            /* were no chars available and the other end has terminated. */
            /* Either way, signal EOF. */
            DBPRINT(("read failed; dest = %d, errno = %d, status = %d\n", dest, terno,
                     UJ[slot].status));
            DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
            return (NIL);

          case UJSOCKET:
          case UJUNUSED:
            return (NIL);
        }
      }

    case 10: /* Change window */
    {
      int rows, cols, pgrp, pty;
      struct winsize w;

      /* Get job #, rows, columns */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], rows, bad);
      N_GETNUMBER(args[3], cols, bad);

      if (valid_slot(slot) && (UJ[slot].type == UJSHELL) && (UJ[slot].status == -1)) {
        w.ws_row = rows;
        w.ws_col = cols;
        w.ws_xpixel = 0; /* not used */
        w.ws_ypixel = 0;
        pty = slot;
        /* Change window size, then
           notify process group of the change */
        if ((ioctl(pty, TIOCSWINSZ, &w) >= 0) &&
            ((pgrp = tcgetpgrp(pty)) >= 0) &&
            (killpg(pgrp, SIGWINCH) >= 0))
          return (ATOM_T);
        return (GetSmallp(errno));
      }

      return (NIL);
    }

    case 12: /* create Unix socket */

    {
      int sockFD;
      struct sockaddr_un sock;

      /* First open the socket */
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }
      /* Then get a process slot and blit the pathname of the
         socket into it */
      /* need to type-check the string here */
      LispStringToCString(args[1], shcom, 2048);
      UJ[sockFD].pathname = malloc(strlen(shcom) + 1);
      strcpy(UJ[sockFD].pathname, shcom);
      /* Then bind it to the pathname, and get it	listening properly */

      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, shcom);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        free(UJ[sockFD].pathname);
        UJ[sockFD].type = UJUNUSED;
        perror("binding Lisp sockets");
        return (NIL);
      }
      DBPRINT(("Socket %d bound to name %s.\n", sockFD, shcom));
      if (listen(sockFD, 1) < 0) perror("Listen");
      /* Set up the IO not to block */
      fcntl(sockFD, F_SETFL, fcntl(sockFD, F_GETFL, 0) | O_NONBLOCK);

      /* things seem sane, fill out the rest of the UJ slot and return */
      UJ[sockFD].status = -1;
      UJ[sockFD].PID = -1;
      UJ[sockFD].type = UJSOCKET;

      return (GetSmallp(sockFD));
    }

    case 13: /* try to accept */
    {
      /* returns file descriptor if successful,
         -1 if no connection available,
         NIL if failure */
      int sockFD, newFD;

      N_GETNUMBER(args[1], sockFD, bad);
      if (UJ[sockFD].type == UJSOCKET && UJ[sockFD].pathname != NULL) {
      /* sockFD SHOULD be non-blocking;
         but I'll time this out just in case */
      case13_lp:
        TIMEOUT(newFD = accept(sockFD, NULL, NULL));
        if (newFD < 0)
          if (errno == EINTR)
            goto case13_lp;
          else if (errno == EWOULDBLOCK)
            return (GetSmallp(-1));
          else {
            perror("Lisp socket accept");
            return (NIL);
          }
        else {
          UJ[newFD].status = -1;
          UJ[newFD].PID = -1;
          UJ[newFD].type = UJSOSTREAM;
          return (GetSmallp(newFD));
        }
      } else
        return (NIL);
    }

    case 14: /* return type of socket */
    {
      int streamFD;

      N_GETNUMBER(args[1], streamFD, bad);
      if (valid_slot(streamFD))
        return GetSmallp(UJ[streamFD].type);
      else
        return NIL;
    }

    case 15: /* Write buffer */
    {
      DLword *bufp;
      int i;
      N_GETNUMBER(args[1], slot, bad);              /* Get job # */
      bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
      N_GETNUMBER(args[3], i, bad);                 /* # to write */
      DBPRINT(("Write buffer, type is %d\n", UJ[slot].type));

      switch (UJ[slot].type) {
        case UJSHELL:
        case UJPROCESS:
        case UJSOSTREAM:
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          dest = write(slot, bufp, i);
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          if (dest > 0) return (GetSmallp(dest));
          /* Something's amiss; update process status */
          wait_for_comm_processes(); /* make sure we're up to date */
          if (((dest == 0) || (errno == EWOULDBLOCK)) && (UJ[slot].status == -1))
            /* No room to write, but other guy still running */
            return (ATOM_T);
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating write failure from PTY desc %d.\n", slot));
          return (NIL);

        case UJUNUSED:
        case UJSOCKET:
          return (NIL);
      }
    }

    default: return (NIL);
  }

bad:
  DBPRINT(("Bad input value."));
  return (NIL);
}